

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgm_tree_index_impl.h
# Opt level: O0

void __thiscall
ted_ub::LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM>::
get_mapped_ancestors_counts
          (LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM> *this,
          TreeIndexLGM *t1,TreeIndexLGM *t2,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *mapping,
          vector<int,_std::allocator<int>_> *t1_count_mapped_anc,
          vector<int,_std::allocator<int>_> *t2_count_mapped_anc)

{
  int iVar1;
  value_type vVar2;
  int iVar3;
  bool bVar4;
  reference ppVar5;
  const_reference pvVar6;
  reference pvVar7;
  int local_b4;
  int local_b0;
  int i_1;
  int i;
  int i_in_post;
  pair<int,_int> *m;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range2;
  undefined1 local_80 [8];
  vector<int,_std::allocator<int>_> t2_mapped_nodes;
  allocator<int> local_51;
  undefined1 local_50 [8];
  vector<int,_std::allocator<int>_> t1_mapped_nodes;
  vector<int,_std::allocator<int>_> *t2_count_mapped_anc_local;
  vector<int,_std::allocator<int>_> *t1_count_mapped_anc_local;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *mapping_local;
  TreeIndexLGM *t2_local;
  TreeIndexLGM *t1_local;
  LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM> *this_local;
  
  iVar1 = (t1->super_Constants).tree_size_;
  t1_mapped_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)t2_count_mapped_anc;
  std::allocator<int>::allocator(&local_51);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_50,(long)iVar1,&local_51);
  std::allocator<int>::~allocator(&local_51);
  iVar1 = (t2->super_Constants).tree_size_;
  std::allocator<int>::allocator((allocator<int> *)((long)&__range2 + 7));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_80,(long)iVar1,
             (allocator<int> *)((long)&__range2 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&__range2 + 7));
  __end2 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin(mapping);
  m = (pair<int,_int> *)
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(mapping);
  while( true ) {
    bVar4 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                *)&m);
    if (!bVar4) break;
    ppVar5 = __gnu_cxx::
             __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
             ::operator*(&__end2);
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_50,(long)ppVar5->first);
    *pvVar7 = 1;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_80,(long)ppVar5->second);
    *pvVar7 = 1;
    __gnu_cxx::
    __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator++(&__end2);
  }
  for (local_b0 = 1; local_b0 < (t1->super_Constants).tree_size_; local_b0 = local_b0 + 1) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(t1->super_PreLToPostL).prel_to_postl_,(long)local_b0);
    iVar1 = *pvVar6;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(t1->super_PostLToParent).postl_to_parent_,(long)iVar1);
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_50,(long)*pvVar6);
    vVar2 = *pvVar7;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](t1_count_mapped_anc,(long)iVar1);
    *pvVar7 = vVar2;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(t1->super_PostLToParent).postl_to_parent_,(long)iVar1);
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_50,(long)*pvVar6);
    iVar3 = *pvVar7;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_50,(long)iVar1);
    *pvVar7 = iVar3 + *pvVar7;
  }
  for (local_b4 = 1; local_b4 < (t2->super_Constants).tree_size_; local_b4 = local_b4 + 1) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(t2->super_PreLToPostL).prel_to_postl_,(long)local_b4);
    iVar1 = *pvVar6;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(t2->super_PostLToParent).postl_to_parent_,(long)iVar1);
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_80,(long)*pvVar6);
    vVar2 = *pvVar7;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        t1_mapped_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,(long)iVar1);
    *pvVar7 = vVar2;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(t2->super_PostLToParent).postl_to_parent_,(long)iVar1);
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_80,(long)*pvVar6);
    iVar3 = *pvVar7;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_80,(long)iVar1);
    *pvVar7 = iVar3 + *pvVar7;
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_80);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_50);
  return;
}

Assistant:

void LGMTreeIndex<CostModel, TreeIndex>::get_mapped_ancestors_counts(
    const TreeIndex& t1, const TreeIndex& t2,
    std::vector<std::pair<int, int>>& mapping,
    std::vector<int>& t1_count_mapped_anc,
    std::vector<int>& t2_count_mapped_anc) const {
  std::vector<int> t1_mapped_nodes(t1.tree_size_); // indexed in postorder
  std::vector<int> t2_mapped_nodes(t2.tree_size_); // indexed in postorder
  for (const auto& m : mapping) {
    t1_mapped_nodes[m.first] = 1;
    t2_mapped_nodes[m.second] = 1;
  }
  int i_in_post = 0;
  // TODO: Verify if t1_mapped_nodes and t2_mapped_nodes are necessary.
  // T1
  for (int i = 1; i < t1.tree_size_; ++i) { // loop in preorder; root has no parent and 0 mapped ancestors
    i_in_post = t1.prel_to_postl_[i];
    t1_count_mapped_anc[i_in_post] = t1_mapped_nodes[t1.postl_to_parent_[i_in_post]];
    t1_mapped_nodes[i_in_post] += t1_mapped_nodes[t1.postl_to_parent_[i_in_post]];
  }
  // T2
  for (int i = 1; i < t2.tree_size_; ++i) { // loop in preorder; root has no parent and 0 mapped ancestors
    i_in_post = t2.prel_to_postl_[i];
    t2_count_mapped_anc[i_in_post] = t2_mapped_nodes[t2.postl_to_parent_[i_in_post]];
    t2_mapped_nodes[i_in_post] += t2_mapped_nodes[t2.postl_to_parent_[i_in_post]];
  }
}